

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O2

QSize __thiscall QDockWidgetGroupWindowItem::maximumSize(QDockWidgetGroupWindowItem *this)

{
  int iVar1;
  undefined4 extraout_var;
  QWidget *this_00;
  QSize QVar2;
  QLayout *pQVar3;
  
  iVar1 = (*(this->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
  this_00 = &QObject::findChild<QDockWidget*>
                       ((QObject *)CONCAT44(extraout_var,iVar1),(FindChildOptions)0x1)->
             super_QWidget;
  if (this_00 != (QWidget *)0x0) {
    QVar2 = QWidget::maximumSize(this_00);
    return QVar2;
  }
  pQVar3 = lay(this);
  QVar2 = (QSize)(**(code **)(*(long *)pQVar3 + 0x98))(pQVar3);
  return QVar2;
}

Assistant:

QSize maximumSize() const override
    {
        auto dw = widget()->findChild<QDockWidget *>();
        if (dw)
            return dw->maximumSize();
        return lay()->maximumSize();
    }